

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32c.cc
# Opt level: O1

uint32_t leveldb::crc32c::Extend(uint32_t crc,char *buf,size_t size)

{
  uint *puVar1;
  long lVar2;
  uint *puVar3;
  uint uVar4;
  uint *puVar5;
  uint *puVar6;
  
  puVar3 = (uint *)(buf + size);
  uVar4 = ~crc;
  puVar1 = (uint *)((ulong)(buf + 3) & 0xfffffffffffffffc);
  puVar5 = (uint *)buf;
  if ((long)puVar1 - (long)buf != 0 && puVar1 <= puVar3) {
    do {
      puVar6 = (uint *)((long)puVar5 + 1);
      uVar4 = uVar4 >> 8 ^ *(uint *)(table0_ + (ulong)((uint)(byte)*puVar5 ^ uVar4 & 0xff) * 4);
      puVar5 = puVar6;
    } while (puVar6 != puVar1);
    buf = buf + ((long)puVar1 - (long)buf);
  }
  for (lVar2 = (long)puVar3 - (long)buf; 0xf < lVar2; lVar2 = lVar2 + -0x10) {
    uVar4 = uVar4 ^ *(uint *)buf;
    uVar4 = *(uint *)(table2_ + (ulong)(uVar4 >> 8 & 0xff) * 4) ^
            *(uint *)(table3_ + (ulong)(uVar4 & 0xff) * 4) ^
            *(uint *)(table1_ + (uVar4 >> 0xe & 0x3fc)) ^
            *(uint *)(table0_ + (ulong)(uVar4 >> 0x18) * 4) ^ *(uint *)((long)buf + 4);
    uVar4 = *(uint *)(table2_ + (ulong)(uVar4 >> 8 & 0xff) * 4) ^
            *(uint *)(table3_ + (ulong)(uVar4 & 0xff) * 4) ^
            *(uint *)(table1_ + (uVar4 >> 0xe & 0x3fc)) ^
            *(uint *)(table0_ + (ulong)(uVar4 >> 0x18) * 4) ^ *(uint *)((long)buf + 8);
    uVar4 = *(uint *)(table2_ + (ulong)(uVar4 >> 8 & 0xff) * 4) ^
            *(uint *)(table3_ + (ulong)(uVar4 & 0xff) * 4) ^
            *(uint *)(table1_ + (uVar4 >> 0xe & 0x3fc)) ^
            *(uint *)(table0_ + (ulong)(uVar4 >> 0x18) * 4) ^ *(uint *)((long)buf + 0xc);
    buf = (char *)((long)buf + 0x10);
    uVar4 = *(uint *)(table2_ + (ulong)(uVar4 >> 8 & 0xff) * 4) ^
            *(uint *)(table3_ + (ulong)(uVar4 & 0xff) * 4) ^
            *(uint *)(table1_ + (uVar4 >> 0xe & 0x3fc)) ^
            *(uint *)(table0_ + (ulong)(uVar4 >> 0x18) * 4);
  }
  for (lVar2 = (long)puVar3 - (long)buf; 3 < lVar2; lVar2 = lVar2 + -4) {
    uVar4 = uVar4 ^ *(uint *)buf;
    uVar4 = *(uint *)(table2_ + (ulong)(uVar4 >> 8 & 0xff) * 4) ^
            *(uint *)(table3_ + (ulong)(uVar4 & 0xff) * 4) ^
            *(uint *)(table1_ + (uVar4 >> 0xe & 0x3fc)) ^
            *(uint *)(table0_ + (ulong)(uVar4 >> 0x18) * 4);
    buf = (char *)((long)buf + 4);
  }
  for (; (uint *)buf != puVar3; buf = (char *)((long)buf + 1)) {
    uVar4 = uVar4 >> 8 ^ *(uint *)(table0_ + (ulong)((uint)(byte)*(uint *)buf ^ uVar4 & 0xff) * 4);
  }
  return ~uVar4;
}

Assistant:

uint32_t Extend(uint32_t crc, const char *buf, size_t size) {
            const uint8_t *p = reinterpret_cast<const uint8_t *>(buf);
            const uint8_t *e = p + size;
            uint32_t l = crc ^0xffffffffu;

#define STEP1 do {                              \
    int c = (l & 0xff) ^ *p++;                  \
    l = table0_[c] ^ (l >> 8);                  \
} while (0)
#define STEP4 do {                              \
    uint32_t c = l ^ LE_LOAD32(p);              \
    p += 4;                                     \
    l = table3_[c & 0xff] ^                     \
        table2_[(c >> 8) & 0xff] ^              \
        table1_[(c >> 16) & 0xff] ^             \
        table0_[c >> 24];                       \
} while (0)

            // Point x at first 4-byte aligned byte in string.  This might be
            // just past the end of the string.
            const uintptr_t pval = reinterpret_cast<uintptr_t>(p);
            const uint8_t *x = reinterpret_cast<const uint8_t *>(((pval + 3) >> 2) << 2);
            if (x <= e) {
                // Process bytes until finished or p is 4-byte aligned
                while (p != x) {
                    STEP1;
                }
            }
            // Process bytes 16 at a time
            while ((e - p) >= 16) {
                STEP4;
                STEP4;
                STEP4;
                STEP4;
            }
            // Process bytes 4 at a time
            while ((e - p) >= 4) {
                STEP4;
            }
            // Process the last few bytes
            while (p != e) {
                STEP1;
            }
#undef STEP4
#undef STEP1
            return l ^ 0xffffffffu;
        }